

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O1

base_learner * bs_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  int iVar2;
  bs *dat;
  option_group_definition *this;
  vector<double,_std::allocator<double>_> *this_00;
  base_learner *l;
  single_learner *base;
  learner<bs,_example> *plVar3;
  size_t sVar4;
  string type_string;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  long local_250;
  _func_int ***local_248;
  _func_int **local_240;
  _func_int **local_238 [2];
  string local_228;
  option_group_definition local_208;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  string local_1b0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined2 local_178;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  dat = calloc_or_throw<bs>(1);
  *(undefined8 *)dat = 0;
  dat->bs_type = 0;
  dat->lb = 0.0;
  dat->ub = 0.0;
  dat->pred_vec = (vector<double,_std::allocator<double>_> *)0x0;
  dat->all = (vw *)0x0;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  local_270.field_2._M_allocated_capacity._0_4_ = 0x6e61656d;
  local_270._M_string_length = 4;
  local_270.field_2._M_local_buf[4] = '\0';
  local_180 = 0x61727473746f6f42;
  local_178 = 0x70;
  local_188 = 9;
  local_208.m_name._M_dataplus._M_p = (pointer)&local_208.m_name.field_2;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char*>((string *)&local_208,&local_180,(long)&local_178 + 1);
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228.field_2._M_allocated_capacity = 0x61727473746f6f62;
  local_228.field_2._8_2_ = 0x70;
  local_228._M_string_length = 9;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_170,&local_228,&dat->B);
  local_100 = true;
  local_248 = local_238;
  local_d0._0_8_ = (_func_int **)0x2f;
  local_248 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_248,(ulong)local_d0);
  local_238[0] = (_func_int **)local_d0._0_8_;
  builtin_strncpy((char *)((long)local_248 + 0x1f),"tance re",8);
  builtin_strncpy((char *)((long)local_248 + 0x27),"sampling",8);
  local_248[2] = (_func_int **)0x6e696c6e6f207962;
  local_248[3] = (_func_int **)0x74726f706d692065;
  *local_248 = (_func_int **)0x6f62207961772d6b;
  local_248[1] = (_func_int **)0x207061727473746f;
  local_240 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_248 + local_d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                   (&local_208,(typed_option<unsigned_int> *)local_170);
  local_1b0.field_2._M_allocated_capacity._0_4_ = 0x745f7362;
  local_1b0.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_1b0._M_string_length = 7;
  local_1b0.field_2._M_local_buf[7] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_1b0,&local_270);
  local_60 = true;
  local_250 = 0x1b;
  local_1d0 = local_1c0;
  local_1d0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_250);
  local_1c0[0] = local_250;
  builtin_strncpy((char *)((long)local_1d0 + 0xb),"type {me",8);
  builtin_strncpy((char *)((long)local_1d0 + 0x13),"an,vote}",8);
  *local_1d0 = 0x6974636964657270;
  local_1d0[1] = 0x2065707974206e6f;
  local_1c8 = local_250;
  *(char *)((long)local_1d0 + local_250) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (this,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  local_d0._0_8_ = &PTR__typed_option_002e8eb0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  local_170._0_8_ = &PTR__typed_option_002e8f90;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_208);
  pp_Var1 = (_func_int **)(local_170 + 0x10);
  local_170._16_8_ = 0x61727473746f6f62;
  local_170._24_2_ = 0x70;
  local_170._8_8_ = (pointer)0x9;
  local_170._0_8_ = pp_Var1;
  iVar2 = (*options->_vptr_options_i[1])(options,local_170);
  if ((_func_int **)local_170._0_8_ != pp_Var1) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar2 == '\0') {
    plVar3 = (learner<bs,_example> *)0x0;
    goto LAB_001d56ab;
  }
  dat->lb = -3.4028235e+38;
  dat->ub = 3.4028235e+38;
  local_170._8_8_ = (pointer)0x7;
  local_170._16_8_ = 0x657079745f7362;
  local_170._0_8_ = pp_Var1;
  iVar2 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_170._0_8_ != pp_Var1) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar2 == '\0') {
LAB_001d5607:
    sVar4 = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_270);
    if (iVar2 == 0) goto LAB_001d5607;
    iVar2 = std::__cxx11::string::compare((char *)&local_270);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "warning: bs_type must be in {\'mean\',\'vote\'}; resetting to mean.",0x3f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      goto LAB_001d5607;
    }
    sVar4 = 1;
  }
  dat->bs_type = sVar4;
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dat->pred_vec = this_00;
  std::vector<double,_std::allocator<double>_>::reserve(this_00,(ulong)dat->B);
  dat->all = all;
  l = setup_base(options,all);
  base = LEARNER::as_singleline<char,char>(l);
  plVar3 = LEARNER::learner<bs,example>::init_learner<LEARNER::learner<char,example>>
                     (dat,base,predict_or_learn<true>,predict_or_learn<false>,(ulong)dat->B,
                      *(prediction_type_t *)(base + 0xd0));
  *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
  *(code **)(plVar3 + 0x68) = finish_example;
  *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
  *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
  *(code **)(plVar3 + 200) = finish;
  dat = (bs *)0x0;
LAB_001d56ab:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_208.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_name._M_dataplus._M_p != &local_208.m_name.field_2) {
    operator_delete(local_208.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if (dat != (bs *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar3;
}

Assistant:

base_learner* bs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<bs>();
  std::string type_string("mean");
  option_group_definition new_options("Bootstrap");
  new_options.add(make_option("bootstrap", data->B).keep().help("k-way bootstrap by online importance resampling"))
      .add(make_option("bs_type", type_string).keep().help("prediction type {mean,vote}"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("bootstrap"))
    return nullptr;

  data->ub = FLT_MAX;
  data->lb = -FLT_MAX;

  if (options.was_supplied("bs_type"))
  {
    if (type_string.compare("mean") == 0)
      data->bs_type = BS_TYPE_MEAN;
    else if (type_string.compare("vote") == 0)
      data->bs_type = BS_TYPE_VOTE;
    else
    {
      std::cerr << "warning: bs_type must be in {'mean','vote'}; resetting to mean." << std::endl;
      data->bs_type = BS_TYPE_MEAN;
    }
  }
  else  // by default use mean
    data->bs_type = BS_TYPE_MEAN;

  data->pred_vec = new vector<double>();
  data->pred_vec->reserve(data->B);
  data->all = &all;

  learner<bs, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->B);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}